

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O2

int Utf8CopyDataProc(size_t index,size_t length,size_t number,Col_RopeChunk *chunks,
                    Col_ClientData clientData)

{
  Col_StringFormat CVar1;
  Col_Char c;
  Col_Char1 *pCVar2;
  Col_Char *data;
  bool bVar3;
  
  data = (Col_Char *)chunks->data;
  while (bVar3 = length != 0, length = length - 1, bVar3) {
    CVar1 = chunks->format;
    if (CVar1 == COL_UTF16) {
      c = Col_Utf16Get((Col_Char2 *)data);
    }
    else if (CVar1 == COL_UCS2) {
      c = (Col_Char)(ushort)*data;
    }
    else if (CVar1 == COL_UCS4) {
      c = *data;
    }
    else if (CVar1 == COL_UTF8) {
      c = Col_Utf8Get((Col_Char1 *)data);
    }
    else {
      c = 0xffffffff;
      if (CVar1 == COL_UCS1) {
        c = (Col_Char)(byte)*data;
      }
    }
    pCVar2 = Col_Utf8Set(*clientData,c);
    *(Col_Char1 **)clientData = pCVar2;
    CVar1 = chunks->format;
    if (CVar1 == COL_UCS1) {
      data = (Col_Char *)((long)data + 1);
    }
    else if (CVar1 == COL_UCS2) {
      data = (Col_Char *)((long)data + 2);
    }
    else if (CVar1 == COL_UCS4) {
      data = data + 1;
    }
    else if (CVar1 == COL_UTF8) {
      data = (Col_Char *)Col_Utf8Next((Col_Char1 *)data);
    }
    else if (CVar1 == COL_UTF16) {
      data = (Col_Char *)Col_Utf16Next((Col_Char2 *)data);
    }
    else {
      data = (Col_Char *)0x0;
    }
  }
  return 0;
}

Assistant:

static int
Utf8CopyDataProc(
    size_t index,                   /*!< Rope-relative index where chunks
                                         begin. */
    size_t length,                  /*!< Length of chunks. */
    size_t number,                  /*!< Number of chunks. Always 1. */
    const Col_RopeChunk *chunks,    /*!< Array of chunks. First chunk never
                                         NULL. */

    /*! [in,out] Points to #CopyDataInfo. */
    Col_ClientData clientData)
{
    CopyDataInfo *info = (CopyDataInfo *) clientData;
    const char *p = (const char *) chunks->data;
    Col_Char c;
    size_t i;

    ASSERT(number == 1);

    for (i = 0; i < length; i++, COL_CHAR_NEXT(chunks->format, p)) {
        c = COL_CHAR_GET(chunks->format, p);
        info->data = (char *) Col_Utf8Set((Col_Char1 *) info->data, c);
    }
    return 0;
}